

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::_do_reorder(Tree *this,size_t *node,size_t count)

{
  Tree *this_00;
  byte *node_00;
  NodeData *in_RDX;
  Tree *in_RSI;
  size_t in_RDI;
  size_t i;
  size_t in_stack_00000140;
  size_t in_stack_00000148;
  Tree *in_stack_00000150;
  Tree *in_stack_ffffffffffffffe0;
  
  if (in_RSI->m_buf != in_RDX) {
    _swap(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    in_RSI->m_buf = in_RDX;
  }
  node_00 = (byte *)((long)&(in_RDX->m_type).type + 1);
  for (this_00 = (Tree *)first_child(in_stack_ffffffffffffffe0,in_RDI);
      this_00 != (Tree *)0xffffffffffffffff; this_00 = (Tree *)next_sibling(this_00,in_RDI)) {
    node_00 = (byte *)_do_reorder(in_RSI,(size_t *)node_00,(size_t)this_00);
  }
  return (size_t)node_00;
}

Assistant:

size_t Tree::_do_reorder(size_t *node, size_t count)
{
    // swap this node if it's not in place
    if(*node != count)
    {
        _swap(*node, count);
        *node = count;
    }
    ++count; // bump the count from this node

    // now descend in the hierarchy
    for(size_t i = first_child(*node); i != NONE; i = next_sibling(i))
    {
        // this child may have been relocated to a different index,
        // so get an updated version
        count = _do_reorder(&i, count);
    }
    return count;
}